

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_diff.cpp
# Opt level: O1

int64_t duckdb::DateDiff::MonthOperator::Operation<duckdb::timestamp_t,duckdb::timestamp_t,long>
                  (timestamp_t startdate,timestamp_t enddate)

{
  date_t d;
  date_t d_00;
  int32_t end_day;
  int32_t end_month;
  int32_t end_year;
  int32_t start_day;
  int32_t start_month;
  int32_t start_year;
  int32_t iStack_48;
  int local_44;
  int local_40;
  int32_t local_3c;
  int local_38;
  int local_34;
  
  d = Timestamp::GetDate(startdate);
  d_00 = Timestamp::GetDate(enddate);
  Date::Convert(d,&local_34,&local_38,&local_3c);
  Date::Convert(d_00,&local_40,&local_44,&iStack_48);
  return (long)((local_44 - local_38) + (local_40 - local_34) * 0xc);
}

Assistant:

int64_t DateDiff::MonthOperator::Operation(timestamp_t startdate, timestamp_t enddate) {
	return MonthOperator::Operation<date_t, date_t, int64_t>(Timestamp::GetDate(startdate),
	                                                         Timestamp::GetDate(enddate));
}